

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O0

SBuf * strfmt_putfstrlen(SBuf *sb,SFormat sf,char *s,MSize len)

{
  uint local_84;
  char *local_78;
  char *w;
  MSize width;
  MSize len_local;
  char *s_local;
  SFormat sf_local;
  SBuf *sb_local;
  char *local_40;
  
  w._0_4_ = sf >> 0x10 & 0xff;
  w._4_4_ = len;
  if ((sf >> 0x18) - 1 < len) {
    w._4_4_ = (sf >> 0x18) - 1;
  }
  local_84 = (uint)w;
  if ((uint)w <= w._4_4_) {
    local_84 = w._4_4_;
  }
  if ((uint)((int)sb->e - (int)sb->w) < local_84) {
    local_40 = lj_buf_more2(sb,local_84);
  }
  else {
    local_40 = sb->w;
  }
  local_78 = local_40;
  if ((sf & 0x100) != 0) {
    memcpy(local_40,s,(ulong)w._4_4_);
    local_78 = local_40 + w._4_4_;
  }
  while (w._4_4_ < (uint)w) {
    *local_78 = ' ';
    local_78 = local_78 + 1;
    w._0_4_ = (uint)w - 1;
  }
  if ((sf & 0x100) == 0) {
    memcpy(local_78,s,(ulong)w._4_4_);
    local_78 = local_78 + w._4_4_;
  }
  sb->w = local_78;
  return sb;
}

Assistant:

static SBuf *strfmt_putfstrlen(SBuf *sb, SFormat sf, const char *s, MSize len)
{
  MSize width = STRFMT_WIDTH(sf);
  char *w;
  if (len > STRFMT_PREC(sf)) len = STRFMT_PREC(sf);
  w = lj_buf_more(sb, width > len ? width : len);
  if ((sf & STRFMT_F_LEFT)) w = lj_buf_wmem(w, s, len);
  while (width-- > len) *w++ = ' ';
  if (!(sf & STRFMT_F_LEFT)) w = lj_buf_wmem(w, s, len);
  sb->w = w;
  return sb;
}